

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

void getDFDComponentInfoUnpacked
               (uint32_t *DFD,uint32_t *numComponents,uint32_t *componentByteLength)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t sampleChannel;
  uint32_t sampleByteLength;
  uint32_t currentChannel;
  uint32_t sampleNumber;
  uint32_t numSamples;
  uint32_t *BDFDB;
  uint32_t *componentByteLength_local;
  uint32_t *numComponents_local;
  uint32_t *DFD_local;
  
  uVar1 = DFD[2];
  currentChannel = 0xffffffff;
  *numComponents = 0;
  for (sampleNumber = 0; sampleNumber < (uVar1 >> 0x12) - 6 >> 2; sampleNumber = sampleNumber + 1) {
    uVar2 = (DFD[(ulong)(sampleNumber * 4 + 6) + 1] >> 0x10 & 0xff) + 1 >> 3;
    uVar3 = DFD[(ulong)(sampleNumber * 4 + 6) + 1] >> 0x18 & 0xf;
    if (uVar3 == currentChannel) {
      *componentByteLength = uVar2 + *componentByteLength;
    }
    else {
      *numComponents = *numComponents + 1;
      *componentByteLength = uVar2;
      currentChannel = uVar3;
    }
  }
  return;
}

Assistant:

void
getDFDComponentInfoUnpacked(const uint32_t* DFD, uint32_t* numComponents,
                            uint32_t* componentByteLength)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;
    uint32_t currentChannel = ~0U; /* Don't start matched. */

    /* This is specifically for unpacked formats which means the size of */
    /* each component is the same. */
    *numComponents = 0;
    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        uint32_t sampleByteLength = (KHR_DFDSVAL(BDFDB, sampleNumber, BITLENGTH) + 1) >> 3U;
        uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleNumber, CHANNELID);

        if (sampleChannel == currentChannel) {
            /* Continuation of the same channel. */
            /* Accumulate the byte length. */
            *componentByteLength += sampleByteLength;
        } else {
            /* Everything is new. Hopefully. */
            currentChannel = sampleChannel;
            (*numComponents)++;
            *componentByteLength = sampleByteLength;
        }
    }
}